

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PCI.H
# Opt level: O3

void __thiscall
amrex::FabArray<amrex::EBCellFlagFab>::PC_local_cpu
          (FabArray<amrex::EBCellFlagFab> *this,CPC *thecpc,FabArray<amrex::EBCellFlagFab> *src,
          int scomp,int dcomp,int ncomp,CpOp op)

{
  Box *pBVar1;
  vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>>>
  *this_00;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *pvVar2;
  EBCellFlagFab *pEVar3;
  EBCellFlagFab *this_01;
  iterator __position;
  pointer pFVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer pVVar7;
  Long LVar8;
  int iVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  FabCopyTag<amrex::EBCellFlagFab> *tag;
  ulong uVar13;
  pointer pFVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  const_iterator __end0;
  Array4<amrex::EBCellFlag> dfab;
  MFIter mfi;
  LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
  loc_copy_tags;
  anon_class_152_5_ce3dc6ec local_278;
  Array4<amrex::EBCellFlag> local_1e0;
  MFIter local_1a0;
  LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
  local_140;
  
  pvVar2 = (thecpc->super_CommMetaData).m_LocTags._M_t.
           super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
           .
           super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
           ._M_head_impl;
  uVar12 = (uint)((ulong)((long)*(pointer *)
                                 ((long)&(pvVar2->
                                         super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                         )._M_impl + 8) -
                         *(long *)&(pvVar2->
                                   super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                   )._M_impl) >> 6);
  if (uVar12 != 0) {
    if ((thecpc->super_CommMetaData).m_threadsafe_loc == true) {
      if (0 < (int)uVar12) {
        uVar13 = (ulong)(uVar12 & 0x7fffffff);
        lVar16 = 0;
        do {
          lVar17 = *(long *)&(((thecpc->super_CommMetaData).m_LocTags._M_t.
                               super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                              ._M_head_impl)->
                             super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                             )._M_impl;
          pBVar1 = (Box *)(lVar17 + lVar16);
          if (((this != src) ||
              (*(int *)(lVar17 + 0x38 + lVar16) != *(int *)(lVar17 + 0x3c + lVar16))) ||
             (bVar10 = Box::operator==((Box *)(lVar17 + lVar16 + 0x1c),pBVar1), !bVar10)) {
            lVar17 = lVar17 + lVar16;
            iVar11 = FabArrayBase::localindex(&src->super_FabArrayBase,*(int *)(lVar17 + 0x3c));
            pEVar3 = (src->m_fabs_v).
                     super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar11];
            iVar11 = FabArrayBase::localindex(&this->super_FabArrayBase,*(int *)(lVar17 + 0x38));
            this_01 = (this->m_fabs_v).
                      super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar11];
            if (op == COPY) {
              BaseFab<amrex::EBCellFlag>::copy<(amrex::RunOn)1>
                        (&this_01->super_BaseFab<amrex::EBCellFlag>,
                         &pEVar3->super_BaseFab<amrex::EBCellFlag>,(Box *)(lVar17 + 0x1c),scomp,
                         pBVar1,dcomp,ncomp);
            }
            else {
              BaseFab<amrex::EBCellFlag>::plus<(amrex::RunOn)1>
                        (&this_01->super_BaseFab<amrex::EBCellFlag>,
                         &pEVar3->super_BaseFab<amrex::EBCellFlag>,(Box *)(lVar17 + 0x1c),pBVar1,
                         scomp,dcomp,ncomp);
            }
          }
          lVar16 = lVar16 + 0x40;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
    }
    else {
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
      ::LayoutData(&local_140,&(this->super_FabArrayBase).boxarray,
                   &(this->super_FabArrayBase).distributionMap);
      if (0 < (int)uVar12) {
        uVar13 = (ulong)(uVar12 & 0x7fffffff);
        lVar16 = 0;
        do {
          lVar17 = *(long *)&(((thecpc->super_CommMetaData).m_LocTags._M_t.
                               super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                              ._M_head_impl)->
                             super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                             )._M_impl;
          pBVar1 = (Box *)(lVar16 + lVar17);
          if (((this != src) ||
              (*(int *)(lVar17 + 0x38 + lVar16) != *(int *)(lVar17 + 0x3c + lVar16))) ||
             (bVar10 = Box::operator==((Box *)(lVar16 + lVar17 + 0x1c),pBVar1), !bVar10)) {
            iVar11 = FabArrayBase::localindex
                               (&local_140.super_FabArrayBase,*(int *)(lVar17 + 0x38 + lVar16));
            this_00 = (vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>>>
                       *)(local_140.m_data.
                          super_vector<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + iVar11);
            iVar11 = FabArrayBase::localindex
                               (&src->super_FabArrayBase,*(int *)(lVar17 + 0x3c + lVar16));
            local_278.dfab.p =
                 (EBCellFlag *)
                 (src->m_fabs_v).
                 super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar11];
            local_278.dfab.jstride = *(Long *)(pBVar1->smallend).vect;
            uVar5 = *(undefined8 *)((pBVar1->smallend).vect + 2);
            uVar6 = *(undefined8 *)((pBVar1->bigend).vect + 2);
            local_278.dfab.nstride._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)(pBVar1->bigend).vect >> 0x20);
            local_278.dfab.nstride._4_4_ = (undefined4)uVar6;
            local_278.dfab.begin.x = (int)((ulong)uVar6 >> 0x20);
            local_278.dfab.kstride._0_4_ = (undefined4)uVar5;
            local_278.dfab.kstride._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
            local_278.dfab.begin.y = *(int *)(lVar17 + 0x1c + lVar16) - *(int *)(lVar17 + lVar16);
            local_278.dfab.begin.z =
                 *(int *)(lVar17 + 0x20 + lVar16) - *(int *)(lVar17 + 4 + lVar16);
            local_278.dfab.end.x = *(int *)(lVar17 + 0x24 + lVar16) - *(int *)(lVar17 + 8 + lVar16);
            __position._M_current = *(FabCopyTag<amrex::EBCellFlagFab> **)(this_00 + 8);
            if (__position._M_current == *(FabCopyTag<amrex::EBCellFlagFab> **)(this_00 + 0x10)) {
              std::
              vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>>>
              ::_M_realloc_insert<amrex::FabCopyTag<amrex::EBCellFlagFab>>
                        (this_00,__position,(FabCopyTag<amrex::EBCellFlagFab> *)&local_278);
            }
            else {
              *(ulong *)&((__position._M_current)->dbox).btype =
                   CONCAT44(local_278.dfab.begin.y,local_278.dfab.begin.x);
              *(ulong *)(((__position._M_current)->offset).vect + 1) =
                   CONCAT44(local_278.dfab.end.x,local_278.dfab.begin.z);
              *(undefined8 *)(((__position._M_current)->dbox).smallend.vect + 2) = uVar5;
              *(ulong *)(((__position._M_current)->dbox).bigend.vect + 1) =
                   CONCAT44(local_278.dfab.nstride._4_4_,(undefined4)local_278.dfab.nstride);
              (__position._M_current)->sfab = (EBCellFlagFab *)local_278.dfab.p;
              *(Long *)((__position._M_current)->dbox).smallend.vect = local_278.dfab.jstride;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x30;
            }
          }
          lVar16 = lVar16 + 0x40;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      MFIter::MFIter(&local_1a0,&this->super_FabArrayBase,'\0');
      if (local_1a0.currentIndex < local_1a0.endIndex) {
        do {
          pVVar7 = local_140.m_data.
                   super_vector<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar11 = local_1a0.currentIndex;
          if (local_1a0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            iVar11 = ((local_1a0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[local_1a0.currentIndex];
          }
          array<amrex::EBCellFlagFab,_0>(&local_1e0,this,&local_1a0);
          pFVar14 = pVVar7[iVar11].
                    super_vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                    .
                    super__Vector_base<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pFVar4 = pVVar7[iVar11].
                   super_vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                   .
                   super__Vector_base<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pEVar3 = (EBCellFlagFab *)local_278.dfab.p;
          LVar8 = local_278.dfab.jstride;
          iVar11 = local_278.dfab.begin.z;
          iVar9 = local_278.dfab.end.x;
          local_278.dfab.p = local_1e0.p;
          local_278.dfab.jstride = local_1e0.jstride;
          local_278.dfab.begin.z = local_1e0.begin.z;
          local_278.dfab.end.x = local_1e0.end.x;
          if (op == COPY) {
            for (; local_1e0.p = local_278.dfab.p, local_1e0.jstride = local_278.dfab.jstride,
                local_1e0.begin.z = local_278.dfab.begin.z, local_1e0.end.x = local_278.dfab.end.x,
                pFVar14 != pFVar4; pFVar14 = pFVar14 + 1) {
              pEVar3 = pFVar14->sfab;
              local_278.offset.x = (pFVar14->offset).vect[0];
              local_278.offset.y = (pFVar14->offset).vect[1];
              local_278.sfab.p = (pEVar3->super_BaseFab<amrex::EBCellFlag>).dptr;
              local_278.sfab.ncomp = (pEVar3->super_BaseFab<amrex::EBCellFlag>).nvar;
              pBVar1 = &(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain;
              local_278.sfab.begin.z =
                   (pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
              local_278.sfab.begin.x = (pBVar1->smallend).vect[0];
              local_278.sfab.begin.y = (pBVar1->smallend).vect[1];
              lVar16 = (long)(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
              iVar11 = (pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
              lVar17 = (long)(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
              local_278.sfab.jstride = ((long)iVar11 - (long)(pBVar1->smallend).vect[0]) + 1;
              local_278.sfab.kstride =
                   (lVar16 - (pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
                   local_278.sfab.jstride;
              local_278.sfab.nstride = (lVar17 - local_278.sfab.begin.z) * local_278.sfab.kstride;
              local_278.sfab.end._0_8_ = (ulong)(iVar11 + 1) | lVar16 << 0x20;
              local_278.offset.z = (pFVar14->offset).vect[2];
              local_278.dfab.begin.x = local_1e0.begin.x;
              local_278.dfab.begin.y = local_1e0.begin.y;
              local_278.dfab.kstride._0_4_ = (undefined4)local_1e0.kstride;
              local_278.dfab.kstride._4_4_ = (undefined4)((ulong)local_1e0.kstride >> 0x20);
              local_278.dfab.nstride._0_4_ = (undefined4)local_1e0.nstride;
              local_278.dfab.nstride._4_4_ = (undefined4)((ulong)local_1e0.nstride >> 0x20);
              local_278.sfab.end.z = (int)lVar17;
              local_278.dcomp = dcomp;
              local_278.scomp = scomp;
              LoopConcurrentOnCpu<amrex::FabArray<amrex::EBCellFlagFab>::PC_local_cpu(amrex::FabArrayBase::CPC_const&,amrex::FabArray<amrex::EBCellFlagFab>const&,int,int,int,amrex::FabArrayBase::CpOp)::_lambda(int,int,int,int)_1_>
                        (&pFVar14->dbox,ncomp,&local_278);
              pEVar3 = (EBCellFlagFab *)local_278.dfab.p;
              LVar8 = local_278.dfab.jstride;
              iVar11 = local_278.dfab.begin.z;
              iVar9 = local_278.dfab.end.x;
              local_278.dfab.p = local_1e0.p;
              local_278.dfab.jstride = local_1e0.jstride;
              local_278.dfab.begin.z = local_1e0.begin.z;
              local_278.dfab.end.x = local_1e0.end.x;
            }
          }
          else {
            for (; local_1e0.p = local_278.dfab.p, local_1e0.jstride = local_278.dfab.jstride,
                local_1e0.begin.z = local_278.dfab.begin.z, local_1e0.end.x = local_278.dfab.end.x,
                pFVar14 != pFVar4; pFVar14 = pFVar14 + 1) {
              pEVar3 = pFVar14->sfab;
              local_278.offset.x = (pFVar14->offset).vect[0];
              local_278.offset.y = (pFVar14->offset).vect[1];
              local_278.sfab.p = (pEVar3->super_BaseFab<amrex::EBCellFlag>).dptr;
              local_278.sfab.ncomp = (pEVar3->super_BaseFab<amrex::EBCellFlag>).nvar;
              pBVar1 = &(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain;
              local_278.sfab.begin.z =
                   (pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
              local_278.sfab.begin.x = (pBVar1->smallend).vect[0];
              local_278.sfab.begin.y = (pBVar1->smallend).vect[1];
              lVar16 = (long)(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
              lVar15 = (long)(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
              lVar17 = (long)(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
              local_278.sfab.jstride = (lVar15 - (pBVar1->smallend).vect[0]) + 1;
              local_278.sfab.kstride =
                   (lVar16 - (pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
                   local_278.sfab.jstride;
              local_278.sfab.nstride = (lVar17 - local_278.sfab.begin.z) * local_278.sfab.kstride;
              local_278.sfab.end._0_8_ = lVar15 + 1U & 0xffffffff | lVar16 << 0x20;
              local_278.offset.z = (pFVar14->offset).vect[2];
              local_278.dfab.begin.x = local_1e0.begin.x;
              local_278.dfab.begin.y = local_1e0.begin.y;
              local_278.dfab.kstride._0_4_ = (undefined4)local_1e0.kstride;
              local_278.dfab.kstride._4_4_ = (undefined4)((ulong)local_1e0.kstride >> 0x20);
              local_278.dfab.nstride._0_4_ = (undefined4)local_1e0.nstride;
              local_278.dfab.nstride._4_4_ = (undefined4)((ulong)local_1e0.nstride >> 0x20);
              local_278.sfab.end.z = (int)lVar17;
              local_278.dcomp = dcomp;
              local_278.scomp = scomp;
              LoopConcurrentOnCpu<amrex::FabArray<amrex::EBCellFlagFab>::PC_local_cpu(amrex::FabArrayBase::CPC_const&,amrex::FabArray<amrex::EBCellFlagFab>const&,int,int,int,amrex::FabArrayBase::CpOp)::_lambda(int,int,int,int)_2_>
                        (&pFVar14->dbox,ncomp,&local_278);
              pEVar3 = (EBCellFlagFab *)local_278.dfab.p;
              LVar8 = local_278.dfab.jstride;
              iVar11 = local_278.dfab.begin.z;
              iVar9 = local_278.dfab.end.x;
              local_278.dfab.p = local_1e0.p;
              local_278.dfab.jstride = local_1e0.jstride;
              local_278.dfab.begin.z = local_1e0.begin.z;
              local_278.dfab.end.x = local_1e0.end.x;
            }
          }
          local_278.dfab.end.x = iVar9;
          local_278.dfab.begin.z = iVar11;
          local_278.dfab.jstride = LVar8;
          local_278.dfab.p = (EBCellFlag *)pEVar3;
          MFIter::operator++(&local_1a0);
        } while (local_1a0.currentIndex < local_1a0.endIndex);
      }
      MFIter::~MFIter(&local_1a0);
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
      ::~LayoutData(&local_140);
    }
  }
  return;
}

Assistant:

void
FabArray<FAB>::PC_local_cpu (const CPC& thecpc, FabArray<FAB> const& src,
                             int scomp, int dcomp, int ncomp, CpOp op)
{
    int N_locs = thecpc.m_LocTags->size();
    if (N_locs == 0) return;
    bool is_thread_safe = thecpc.m_threadsafe_loc;

    if (is_thread_safe)
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = (*thecpc.m_LocTags)[i];
            if (this != &src || tag.dstIndex != tag.srcIndex || tag.sbox != tag.dbox) {
                // avoid self copy or plus
                const FAB* sfab = &(src[tag.srcIndex]);
                      FAB* dfab = &(get(tag.dstIndex));
                if (op == FabArrayBase::COPY)
                {
                    dfab->template copy<RunOn::Host>(*sfab, tag.sbox, scomp, tag.dbox, dcomp, ncomp);
                }
                else
                {
                    dfab->template plus<RunOn::Host>(*sfab, tag.sbox, tag.dbox, scomp, dcomp, ncomp);
                }
            }
        }
    }
    else
    {
        LayoutData<Vector<FabCopyTag<FAB> > > loc_copy_tags(boxArray(),DistributionMap());
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = (*thecpc.m_LocTags)[i];
            if (this != &src || tag.dstIndex != tag.srcIndex || tag.sbox != tag.dbox) {
                loc_copy_tags[tag.dstIndex].push_back
                    ({src.fabPtr(tag.srcIndex), tag.dbox, tag.sbox.smallEnd()-tag.dbox.smallEnd()});
            }
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            const auto& tags = loc_copy_tags[mfi];
            auto dfab = this->array(mfi);
            if (op == FabArrayBase::COPY)
            {
                for (auto const & tag : tags)
                {
                    auto const sfab = tag.sfab->array();
                    Dim3 offset = tag.offset.dim3();
                    amrex::LoopConcurrentOnCpu (tag.dbox, ncomp,
                    [=] (int i, int j, int k, int n) noexcept
                    {
                        dfab(i,j,k,dcomp+n) = sfab(i+offset.x,j+offset.y,k+offset.z,scomp+n);
                    });
                }
            }
            else
            {
                for (auto const & tag : tags)
                {
                    auto const sfab = tag.sfab->array();
                    Dim3 offset = tag.offset.dim3();
                    amrex::LoopConcurrentOnCpu (tag.dbox, ncomp,
                    [=] (int i, int j, int k, int n) noexcept
                    {
                        dfab(i,j,k,dcomp+n) += sfab(i+offset.x,j+offset.y,k+offset.z,scomp+n);
                    });
                }
            }
        }
    }
}